

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

void __thiscall ncnn::ConvolutionDepthWise::~ConvolutionDepthWise(ConvolutionDepthWise *this)

{
  pointer ppLVar1;
  pointer ppLVar2;
  int i_1;
  int i;
  long lVar3;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__ConvolutionDepthWise_0013ad68;
  lVar3 = 0;
  while( true ) {
    ppLVar1 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3) <= lVar3) break;
    if (ppLVar1[lVar3] != (Layer *)0x0) {
      (*ppLVar1[lVar3]->_vptr_Layer[1])();
    }
    lVar3 = lVar3 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  lVar3 = 0;
  while( true ) {
    ppLVar1 = (this->dequantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppLVar2 = (this->dequantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3) <= lVar3) break;
    if (ppLVar1[lVar3] != (Layer *)0x0) {
      (*ppLVar1[lVar3]->_vptr_Layer[1])();
    }
    lVar3 = lVar3 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar1;
  }
  std::_Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~_Vector_base
            (&(this->dequantize_ops).
              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>);
  std::_Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~_Vector_base
            (&(this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            );
  Mat::~Mat(&this->bottom_blob_int8_scales);
  Mat::~Mat(&this->weight_data_int8_scales);
  Mat::~Mat(&this->bias_data);
  Mat::~Mat(&this->weight_data);
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

ConvolutionDepthWise::~ConvolutionDepthWise()
{
    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();
}